

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.h
# Opt level: O1

EvaluationFunction *
imrt::EvaluationFunction::getInstance
          (vector<imrt::Volume,_std::allocator<imrt::Volume>_> *volumes,Collimator *collimator)

{
  EvaluationFunction *this;
  
  if (instance == (EvaluationFunction *)0x0) {
    this = (EvaluationFunction *)operator_new(0x180);
    EvaluationFunction(this,volumes,collimator);
    instance = this;
  }
  return instance;
}

Assistant:

static EvaluationFunction& getInstance(vector<Volume>& volumes, const Collimator& collimator){
		if(!instance) instance = new EvaluationFunction(volumes, collimator);
		return *instance;
	}